

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O2

void Gia_ManCollectTfi_rec(Gia_Man_t *p,int iObj,Vec_Int_t *vNodes)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  
  iVar1 = Gia_ObjIsTravIdCurrentId(p,iObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrentId(p,iObj);
    pGVar3 = Gia_ManObj(p,iObj);
    uVar2 = (uint)*(undefined8 *)pGVar3;
    if ((~uVar2 & 0x9fffffff) != 0) {
      if ((-1 < (int)uVar2) && ((uVar2 & 0x1fffffff) != 0x1fffffff)) {
        Gia_ManCollectTfi_rec(p,iObj - (uVar2 & 0x1fffffff),vNodes);
        Gia_ManCollectTfi_rec(p,iObj - (*(uint *)&pGVar3->field_0x4 & 0x1fffffff),vNodes);
        Vec_IntPush(vNodes,iObj);
        return;
      }
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDfs.c"
                    ,0x224,"void Gia_ManCollectTfi_rec(Gia_Man_t *, int, Vec_Int_t *)");
    }
  }
  return;
}

Assistant:

void Gia_ManCollectTfi_rec( Gia_Man_t * p, int iObj, Vec_Int_t * vNodes )
{
    Gia_Obj_t * pObj;
    if ( Gia_ObjIsTravIdCurrentId(p, iObj) )
        return;
    Gia_ObjSetTravIdCurrentId(p, iObj);
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsCi(pObj) )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ManCollectTfi_rec( p, Gia_ObjFaninId0(pObj, iObj), vNodes );
    Gia_ManCollectTfi_rec( p, Gia_ObjFaninId1(pObj, iObj), vNodes );
    Vec_IntPush( vNodes, iObj );
}